

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

vault * themed_level(wchar_t index)

{
  vault *local_18;
  vault *level;
  wchar_t which;
  wchar_t index_local;
  
  level._0_4_ = (uint)player->themed_level;
  local_18 = themed_levels;
  if (index < L'\x01') {
    __assert_fail("index >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-world.c"
                  ,0xc6,"struct vault *themed_level(int)");
  }
  while( true ) {
    if ((int)(uint)level < 2) {
      return local_18;
    }
    local_18 = local_18->next;
    if (local_18 == (vault *)0x0) break;
    level._0_4_ = (uint)level - 1;
  }
  __assert_fail("level",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-world.c"
                ,0xcb,"struct vault *themed_level(int)");
}

Assistant:

struct vault *themed_level(int index)
{
	int which = player->themed_level;
	struct vault *level = themed_levels;
	assert(index >= 1);

	/* Iterate to the themed level */
	while (which > 1) {
		level = level->next;
		assert(level);
		which--;
	}
	return level;
}